

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::FieldGeneratorMap::SetOneofIndexBase
          (FieldGeneratorMap *this,int index_base)

{
  int iVar1;
  scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator> *this_00;
  FieldGenerator *this_01;
  int local_18;
  int i;
  int index_base_local;
  FieldGeneratorMap *this_local;
  
  local_18 = 0;
  while( true ) {
    iVar1 = Descriptor::field_count(this->descriptor_);
    if (iVar1 <= local_18) break;
    this_00 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>_>
              ::operator[](&this->field_generators_,(long)local_18);
    this_01 = internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::
              operator->(this_00);
    FieldGenerator::SetOneofIndexBase(this_01,index_base);
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void FieldGeneratorMap::SetOneofIndexBase(int index_base) {
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_[i]->SetOneofIndexBase(index_base);
  }
}